

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

leaf_t add_container(roaring64_bitmap_t *r,container_t *container,uint8_t typecode)

{
  ulong uVar1;
  container_t **ppcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t size;
  
  uVar1 = r->first_free;
  uVar3 = r->capacity;
  if (uVar1 == uVar3) {
    if (uVar3 == 0) {
      uVar6 = 2;
    }
    else if (uVar3 < 0x400) {
      uVar6 = uVar3 * 2;
    }
    else {
      uVar6 = uVar3 * 5 >> 2;
    }
    ppcVar2 = (container_t **)roaring_realloc(r->containers,uVar6 * 8);
    r->containers = ppcVar2;
    memset(ppcVar2 + r->capacity,0,(uVar6 - uVar3) * 8);
    r->capacity = uVar6;
  }
  uVar3 = r->first_free;
  uVar6 = r->capacity;
  uVar5 = uVar3 + 1;
  if (uVar3 + 1 < uVar6) {
    uVar5 = uVar6;
  }
  do {
    uVar3 = uVar3 + 1;
    uVar4 = uVar5;
    if (uVar6 <= uVar3) break;
    uVar4 = uVar3;
  } while (r->containers[uVar3] != (container_t *)0x0);
  if (uVar4 < uVar6) {
    uVar6 = uVar4;
  }
  r->first_free = uVar6;
  r->containers[uVar1] = container;
  return (ulong)typecode | uVar1 << 8;
}

Assistant:

static leaf_t add_container(roaring64_bitmap_t *r, container_t *container,
                            uint8_t typecode) {
    uint64_t index = allocate_index(r);
    r->containers[index] = container;
    return create_leaf(index, typecode);
}